

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

uint __thiscall
llvm::detail::IEEEFloat::convertToHexString
          (IEEEFloat *this,char *dst,uint hexDigits,bool upperCase,roundingMode rounding_mode)

{
  undefined8 uVar1;
  char *pcVar2;
  byte *pbVar3;
  
  pbVar3 = (byte *)dst;
  if ((this->field_0x12 & 8) != 0) {
    pbVar3 = (byte *)(dst + 1);
    *dst = '-';
  }
  switch(this->field_0x12 & 7) {
  case 0:
    uVar1 = 0x7974696e69666e69;
    if (upperCase) {
      uVar1 = 0x5954494e49464e49;
    }
    *(undefined8 *)pbVar3 = uVar1;
    pbVar3 = pbVar3 + 8;
    break;
  case 1:
    pcVar2 = "nan";
    if (upperCase) {
      pcVar2 = "NAN";
    }
    pbVar3[2] = pcVar2[2];
    *(undefined2 *)pbVar3 = *(undefined2 *)pcVar2;
    pbVar3 = pbVar3 + 3;
    break;
  case 2:
    pbVar3 = (byte *)convertNormalToHexString(this,(char *)pbVar3,hexDigits,upperCase,rounding_mode)
    ;
    break;
  case 3:
    *pbVar3 = 0x30;
    pbVar3[1] = !upperCase * ' ' + 0x58;
    pbVar3[2] = 0x30;
    if (hexDigits < 2) {
      pbVar3 = pbVar3 + 3;
    }
    else {
      pbVar3[3] = 0x2e;
      memset(pbVar3 + 4,0x30,(ulong)(hexDigits - 1));
      pbVar3 = pbVar3 + (ulong)(hexDigits - 1) + 4;
    }
    *pbVar3 = !upperCase * ' ' | 0x50;
    pbVar3[1] = 0x30;
    pbVar3 = pbVar3 + 2;
  }
  *pbVar3 = 0;
  return (int)pbVar3 - (int)dst;
}

Assistant:

unsigned int IEEEFloat::convertToHexString(char *dst, unsigned int hexDigits,
                                           bool upperCase,
                                           roundingMode rounding_mode) const {
  char *p;

  p = dst;
  if (sign)
    *dst++ = '-';

  switch (category) {
  case fcInfinity:
    memcpy (dst, upperCase ? infinityU: infinityL, sizeof infinityU - 1);
    dst += sizeof infinityL - 1;
    break;

  case fcNaN:
    memcpy (dst, upperCase ? NaNU: NaNL, sizeof NaNU - 1);
    dst += sizeof NaNU - 1;
    break;

  case fcZero:
    *dst++ = '0';
    *dst++ = upperCase ? 'X': 'x';
    *dst++ = '0';
    if (hexDigits > 1) {
      *dst++ = '.';
      memset (dst, '0', hexDigits - 1);
      dst += hexDigits - 1;
    }
    *dst++ = upperCase ? 'P': 'p';
    *dst++ = '0';
    break;

  case fcNormal:
    dst = convertNormalToHexString (dst, hexDigits, upperCase, rounding_mode);
    break;
  }

  *dst = 0;

  return static_cast<unsigned int>(dst - p);
}